

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::openWebSocket
          (PromiseNetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  undefined8 uVar1;
  EventLoop *pEVar2;
  undefined8 uVar3;
  void *pvVar4;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  _func_int **pp_Var6;
  PromiseArena *pPVar7;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *__n;
  TransformPromiseNodeBase *this_00;
  StringPtr url_00;
  String urlCopy;
  HttpHeaders headersCopy;
  undefined1 local_1d0 [16];
  PromiseArena *pPStack_1c0;
  EventLoop *local_1b8;
  Array<char> *local_1a8;
  PromiseArena *local_1a0;
  PromiseArena *local_198;
  PromiseArena *local_190;
  ArrayDisposer *local_188;
  HttpHeaderTable *local_180;
  OwnPromiseNode local_178;
  Header *local_170;
  ForkBranchBase *local_168;
  Context *local_160;
  PromiseArena *local_158;
  undefined1 local_150 [40];
  HttpHeaders local_128;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  HttpHeaders local_a8;
  SourceLocation local_48;
  HttpHeaders *pHVar5;
  
  url_00.content.size_ = (void *)url.content.size_;
  pp_Var6 = (_func_int **)url.content.ptr;
  if (pp_Var6[4] == (_func_int *)0x0) {
    pHVar5 = headers;
    __arg = in_R8;
    heapString((String *)(local_1d0 + 8),
               (size_t)((long)&headers[-1].ownedStrings.builder.disposer + 7));
    __flags = (int)pHVar5;
    __n = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
    pvVar4 = extraout_RDX;
    if (__n != (undefined1 *)0x0) {
      pPVar7 = pPStack_1c0;
      if (pPStack_1c0 != (PromiseArena *)0x0) {
        pPVar7 = (PromiseArena *)local_1d0._8_8_;
      }
      memcpy(pPVar7,url_00.content.size_,(size_t)__n);
      pvVar4 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_128,in_R8,pvVar4,__flags,__arg);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_1d0);
    local_150._0_8_ = local_128.ownedStrings.builder.endPtr;
    local_170 = local_128.unindexedHeaders.builder.endPtr;
    local_168 = (ForkBranchBase *)local_128.unindexedHeaders.builder.pos;
    local_160 = (Context *)local_128.unindexedHeaders.builder.ptr;
    local_188 = (ArrayDisposer *)local_128.indexedHeaders.size_;
    local_158 = (PromiseArena *)local_128.indexedHeaders.ptr;
    pEVar2 = local_1b8;
    uVar1 = local_1d0._0_8_;
    local_1a0 = (PromiseArena *)local_1d0._8_8_;
    local_c0 = local_1d0._8_8_;
    local_198 = pPStack_1c0;
    uStack_b8 = pPStack_1c0;
    local_128.indexedHeaders.ptr = (StringPtr *)0x0;
    local_128.indexedHeaders.size_ = 0;
    local_128.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_128.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_128.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_128.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_b0 = local_1b8;
    local_1d0._8_8_ = (PromiseArena *)0x0;
    pPStack_1c0 = (PromiseArena *)0x0;
    local_180 = local_128.table;
    local_a8.table = local_128.table;
    local_a8.indexedHeaders.ptr = (StringPtr *)local_158;
    local_a8.indexedHeaders.size_ = (size_t)local_188;
    local_190 = (PromiseArena *)local_128.indexedHeaders.disposer;
    local_a8.indexedHeaders.disposer = local_128.indexedHeaders.disposer;
    local_a8.unindexedHeaders.builder.ptr = (Header *)local_160;
    local_a8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)local_168;
    local_a8.unindexedHeaders.builder.endPtr = local_170;
    local_178.ptr = (PromiseNode *)local_128.unindexedHeaders.builder.disposer;
    local_a8.unindexedHeaders.builder.disposer = local_128.unindexedHeaders.builder.disposer;
    local_1a8 = local_128.ownedStrings.builder.ptr;
    local_a8.ownedStrings.builder.ptr = local_128.ownedStrings.builder.ptr;
    local_150._8_8_ = local_128.ownedStrings.builder.pos;
    local_a8.ownedStrings.builder.pos = local_128.ownedStrings.builder.pos;
    local_a8.ownedStrings.builder.endPtr = (Array<char> *)local_150._0_8_;
    local_150._16_8_ = local_128.ownedStrings.builder.disposer;
    local_a8.ownedStrings.builder.disposer = local_128.ownedStrings.builder.disposer;
    local_128.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_128.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    pPVar7 = ((PromiseArenaMember *)local_1d0._0_8_)->arena;
    local_150._24_8_ = this;
    local_c8 = pp_Var6;
    if (pPVar7 == (PromiseArena *)0x0 || (ulong)(local_1d0._0_8_ - (long)pPVar7) < 0xa0) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x360);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_1d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6241:11)>
                 ::anon_class_128_3_9f8f6369_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x360) = &PTR_destroy_0061bbc0;
      *(_func_int ***)((long)pvVar4 + 0x380) = pp_Var6;
      *(PromiseArena **)((long)pvVar4 + 0x388) = local_1a0;
      *(PromiseArena **)((long)pvVar4 + 0x390) = local_198;
      *(EventLoop **)((long)pvVar4 + 0x398) = pEVar2;
      *(HttpHeaderTable **)((long)pvVar4 + 0x3a0) = local_180;
      *(PromiseArena **)((long)pvVar4 + 0x3a8) = local_158;
      *(ArrayDisposer **)((long)pvVar4 + 0x3b0) = local_188;
      *(PromiseArena **)((long)pvVar4 + 0x3b8) = local_190;
      *(Context **)((long)pvVar4 + 0x3c0) = local_160;
      *(ForkBranchBase **)((long)pvVar4 + 0x3c8) = local_168;
      *(Header **)((long)pvVar4 + 0x3d0) = local_170;
      *(PromiseNode **)((long)pvVar4 + 0x3d8) = local_178.ptr;
      *(Array<char> **)((long)pvVar4 + 0x3e0) = local_1a8;
      *(undefined8 *)((long)pvVar4 + 1000) = local_150._8_8_;
      *(undefined8 *)((long)pvVar4 + 0x3f0) = local_150._0_8_;
      *(undefined8 *)((long)pvVar4 + 0x3f8) = local_150._16_8_;
      *(void **)((long)pvVar4 + 0x368) = pvVar4;
    }
    else {
      ((PromiseArenaMember *)local_1d0._0_8_)->arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_1d0._0_8_ + -0xa0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_1d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6241:11)>
                 ::anon_class_128_3_9f8f6369_for_func::operator());
      ((PromiseArenaMember *)(uVar1 + -0xa0))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0061bbc0;
      ((PromiseArenaMember *)(uVar1 + -0x80))->_vptr_PromiseArenaMember = pp_Var6;
      ((PromiseArenaMember *)(uVar1 + -0x80))->arena = local_1a0;
      ((PromiseArenaMember *)(uVar1 + -0x70))->_vptr_PromiseArenaMember = (_func_int **)local_198;
      ((PromiseArenaMember *)(uVar1 + -0x70))->arena = (PromiseArena *)pEVar2;
      ((PromiseArenaMember *)(uVar1 + -0x60))->_vptr_PromiseArenaMember = (_func_int **)local_180;
      ((PromiseArenaMember *)(uVar1 + -0x60))->arena = local_158;
      ((PromiseArenaMember *)(uVar1 + -0x50))->_vptr_PromiseArenaMember = (_func_int **)local_188;
      ((PromiseArenaMember *)(uVar1 + -0x50))->arena = local_190;
      ((PromiseArenaMember *)(uVar1 + -0x40))->_vptr_PromiseArenaMember = (_func_int **)local_160;
      ((PromiseArenaMember *)(uVar1 + -0x40))->arena = (PromiseArena *)local_168;
      ((PromiseArenaMember *)(uVar1 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)local_170;
      ((PromiseArenaMember *)(uVar1 + -0x30))->arena = (PromiseArena *)local_178.ptr;
      ((PromiseArenaMember *)(uVar1 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)local_1a8;
      ((PromiseArenaMember *)(uVar1 + -0x20))->arena = (PromiseArena *)local_150._8_8_;
      ((PromiseArenaMember *)(uVar1 + -0x10))->_vptr_PromiseArenaMember =
           (_func_int **)local_150._0_8_;
      ((PromiseArenaMember *)(uVar1 + -0x10))->arena = (PromiseArena *)local_150._16_8_;
      ((PromiseArenaMember *)(uVar1 + -0xa0))->arena = pPVar7;
    }
    this = (PromiseNetworkAddressHttpClient *)local_150._24_8_;
    local_a8.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_a8.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_a8.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_a8.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_a8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_a8.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_a8.indexedHeaders.size_ = 0;
    local_a8.indexedHeaders.ptr = (StringPtr *)0x0;
    uStack_b8 = (void *)0x0;
    local_c0 = (void *)0x0;
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_48.function = "then";
    local_48._16_8_ = &DAT_4c0000058b;
    local_150._32_8_ = this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)local_150._24_8_,(OwnPromiseNode *)(local_150 + 0x20),&local_48);
    uVar1 = local_150._32_8_;
    if ((TransformPromiseNodeBase *)local_150._32_8_ != (TransformPromiseNodeBase *)0x0) {
      local_150._32_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    HttpHeaders::~HttpHeaders(&local_a8);
    uVar3 = uStack_b8;
    uVar1 = local_c0;
    if ((void *)local_c0 != (void *)0x0) {
      local_c0 = (void *)0x0;
      uStack_b8 = (void *)0x0;
      (*(code *)**(undefined8 **)local_b0)(local_b0,uVar1,1,uVar3,uVar3,0);
    }
    uVar1 = local_1d0._0_8_;
    if ((PromiseArenaMember *)local_1d0._0_8_ != (PromiseArenaMember *)0x0) {
      local_1d0._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
    HttpHeaders::~HttpHeaders(&local_128);
    pPVar7 = pPStack_1c0;
    uVar1 = local_1d0._8_8_;
    if ((PromiseArena *)local_1d0._8_8_ != (PromiseArena *)0x0) {
      local_1d0._8_8_ = (PromiseArena *)0x0;
      pPStack_1c0 = (PromiseArena *)0x0;
      (*(code *)((local_1b8->port).ptr)->_vptr_EventPort)(local_1b8,uVar1,1,pPVar7,pPVar7,0);
    }
  }
  else {
    url_00.content.ptr = (char *)pp_Var6[4];
    NetworkAddressHttpClient::openWebSocket((NetworkAddressHttpClient *)this,url_00,headers);
  }
  return (Promise<kj::HttpClient::WebSocketResponse>)(PromiseNode *)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    KJ_IF_SOME(c, client) {
      return c->openWebSocket(url, headers);
    } else {
      auto urlCopy = kj::str(url);
      auto headersCopy = headers.clone();
      return promise.addBranch().then(
          [this,url=kj::mv(urlCopy),headers=kj::mv(headersCopy)]() {
        return KJ_ASSERT_NONNULL(client)->openWebSocket(url, headers);
      });
    }